

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O3

void __thiscall
TEST_MockExpectedCall_callWithThreeDifferentParameter_Test::
~TEST_MockExpectedCall_callWithThreeDifferentParameter_Test
          (TEST_MockExpectedCall_callWithThreeDifferentParameter_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithThreeDifferentParameter)
{
    call->withParameter("integer", 1);
    call->withParameter("string", "hello world");
    call->withParameter("double", 0.12);
    STRCMP_EQUAL("int", call->getInputParameterType("integer").asCharString());
    STRCMP_EQUAL("const char*", call->getInputParameterType("string").asCharString());
    STRCMP_EQUAL("double", call->getInputParameterType("double").asCharString());
    LONGS_EQUAL(1, call->getInputParameter("integer").getIntValue());
    STRCMP_EQUAL("hello world", call->getInputParameter("string").getStringValue());
    DOUBLES_EQUAL(0.12, call->getInputParameter("double").getDoubleValue(), 0.05);
}